

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

SQInteger __thiscall SQFunctionProto::GetLine(SQFunctionProto *this,SQInstruction *curr)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  SQInteger curop;
  SQInteger mid;
  SQInteger high;
  SQInteger low;
  SQInteger line;
  SQInteger op;
  SQInstruction *curr_local;
  SQFunctionProto *this_local;
  
  lVar3 = (long)curr - (long)this->_instructions >> 3;
  high = 0;
  mid = this->_nlineinfos + -1;
  curop = 0;
  while (high <= mid) {
    curop = high + (mid - high >> 1);
    lVar1 = this->_lineinfos[curop]._op;
    if (lVar3 < lVar1) {
      mid = curop + -1;
    }
    else {
      if ((lVar3 <= lVar1) ||
         ((curop < this->_nlineinfos + -1 && (lVar3 <= this->_lineinfos[curop + 1]._op)))) break;
      high = curop + 1;
    }
  }
  while( true ) {
    bVar2 = false;
    if (0 < curop) {
      bVar2 = lVar3 <= this->_lineinfos[curop]._op;
    }
    if (!bVar2) break;
    curop = curop + -1;
  }
  return this->_lineinfos[curop]._line;
}

Assistant:

SQInteger SQFunctionProto::GetLine(SQInstruction *curr)
{
    SQInteger op = (SQInteger)(curr-_instructions);
    SQInteger line=_lineinfos[0]._line;
    SQInteger low = 0;
    SQInteger high = _nlineinfos - 1;
    SQInteger mid = 0;
    while(low <= high)
    {
        mid = low + ((high - low) >> 1);
        SQInteger curop = _lineinfos[mid]._op;
        if(curop > op)
        {
            high = mid - 1;
        }
        else if(curop < op) {
            if(mid < (_nlineinfos - 1)
                && _lineinfos[mid + 1]._op >= op) {
                break;
            }
            low = mid + 1;
        }
        else { //equal
            break;
        }
    }

    while(mid > 0 && _lineinfos[mid]._op >= op) mid--;

    line = _lineinfos[mid]._line;

    return line;
}